

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialogPrivate::~QDialogPrivate(QDialogPrivate *this)

{
  ~QDialogPrivate(this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

QDialogPrivate::~QDialogPrivate()
{
    delete m_platformHelper;
}